

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_35995e::ProducedDirectoryNodeTask::provideValue
          (ProducedDirectoryNodeTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,
          ValueType *valueData)

{
  Command *pCVar1;
  char *pcVar2;
  size_type sVar3;
  size_type sVar4;
  StringRef name;
  BuildValue value;
  TaskInterface local_138;
  StringList local_128;
  BuildKey local_118;
  BuildValue local_f8;
  BuildValue local_88;
  
  local_138.ctx = ti.ctx;
  local_138.impl = ti.impl;
  if (inputID == 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->directorySignature,valueData);
    return;
  }
  if (inputID == 0) {
    local_f8._0_8_ =
         (valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
    local_f8.signature.value =
         (long)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish - local_f8._0_8_;
    local_f8.valueData.asOutputInfo.device = 0;
    llbuild::buildsystem::BuildValue::BuildValue(&local_88,(BinaryDecoder *)&local_f8);
    pCVar1 = this->producingCommand;
    if (pCVar1 == (Command *)0x0) {
      __assert_fail("producingCommand",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x360,
                    "virtual void (anonymous namespace)::ProducedDirectoryNodeTask::provideValue(TaskInterface, uintptr_t, const KeyType &, const ValueType &)"
                   );
    }
    (*(pCVar1->super_JobDescriptor)._vptr_JobDescriptor[0xd])(&local_f8,pCVar1,this->node);
    llbuild::buildsystem::BuildValue::operator=(&this->nodeResult,&local_f8);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_f8);
    if ((this->nodeResult).kind == ExistingInput) {
      pcVar2 = (this->node->name)._M_dataplus._M_p;
      sVar3 = (this->node->name)._M_string_length;
      if (sVar3 == 0) {
        sVar4 = 0;
      }
      else {
        sVar4 = sVar3;
        if ((pcVar2[sVar3 - 1] == '/') && ((sVar3 != 1 || (sVar4 = 1, *pcVar2 != '/')))) {
          sVar4 = sVar3 - 1;
        }
      }
      local_128.contents = (char *)0x0;
      local_128.size = 0;
      name.Length = sVar4;
      name.Data = pcVar2;
      llbuild::buildsystem::BuildKey::BuildKey<llbuild::basic::StringList>
                (&local_118,'S',name,&local_128);
      local_f8._0_8_ = &local_f8.valueData;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_118.key.key._M_dataplus._M_p,
                 local_118.key.key._M_dataplus._M_p + local_118.key.key._M_string_length);
      llbuild::core::TaskInterface::request(&local_138,(KeyType *)&local_f8,1);
      if ((anon_union_80_2_ecfed234_for_valueData *)local_f8._0_8_ != &local_f8.valueData) {
        operator_delete((void *)local_f8._0_8_,(ulong)(local_f8.valueData.asOutputInfo.device + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.key.key._M_dataplus._M_p != &local_118.key.key.field_2) {
        operator_delete(local_118.key.key._M_dataplus._M_p,
                        local_118.key.key.field_2._M_allocated_capacity + 1);
      }
      if (local_128.contents != (char *)0x0) {
        operator_delete__(local_128.contents);
      }
      this->returnDirectorySignature = true;
    }
    llbuild::buildsystem::BuildValue::~BuildValue(&local_88);
  }
  return;
}

Assistant:

virtual void provideValue(TaskInterface ti, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    if (inputID == 0) {
      auto value = BuildValue::fromData(valueData);

      // Extract the node result from the command.
      assert(producingCommand);

      // NOTE: nodeResult only contains stat info of the directory, not its signature.
      nodeResult = producingCommand->getResultForOutput(&node, value);

      if (nodeResult.isExistingInput()) {
        // The external command must have produced the directory node.
        // Request for its signature and store it

        StringRef path =  node.getName();
        if (path.endswith("/") && path != "/") {
          path = path.substr(0, path.size() - 1);
        }
        ti.request(BuildKey::makeDirectoryTreeSignature(path,basic::StringList()).toData(), /*inputID=*/1);
        returnDirectorySignature = true;
      }
    } else if (inputID == 1) {
      directorySignature = valueData;
    }
  }